

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::TextureFboAttacher::attach
          (TextureFboAttacher *this,GLuint texture,GLuint fbo)

{
  GLenum GVar1;
  deBool dVar2;
  Functions *pFVar3;
  GLuint fbo_local;
  GLuint texture_local;
  TextureFboAttacher *this_local;
  
  do {
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,fbo);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glBindFramebuffer(GL_FRAMEBUFFER, fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x14c);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,0x8ce0,0xde1,texture,0);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,
                    "glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x150);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,0);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glBindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x153);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void TextureFboAttacher::attach (GLuint texture, GLuint fbo)
{
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, fbo),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
								  GL_TEXTURE_2D, texture, 0),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, 0),
		gl().getError());
}